

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool project_aimed(source origin,wchar_t typ,wchar_t dir,wchar_t dam,wchar_t flg,object *obj)

{
  long lVar1;
  _Bool _Var2;
  uint32_t uVar3;
  loc finish;
  monster *pmVar4;
  wchar_t wVar5;
  bool bVar6;
  source origin_00;
  loc grid;
  
  origin_00.which = origin.which;
  origin_00.what = origin.what;
  finish = (loc)loc(-1,-1);
  wVar5 = flg | 4;
  grid = finish;
  if (origin_00.what == SRC_PLAYER) {
    if ((dir == L'\x05') && (_Var2 = target_okay(), _Var2)) {
      target_get((loc_conflict *)&grid);
      finish = grid;
    }
    else {
      finish = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[dir]);
      grid = finish;
    }
    goto LAB_00137a8f;
  }
  if (origin_00.what == SRC_MONSTER) {
    pmVar4 = cave_monster(cave,origin.which._0_4_);
    if (pmVar4 == (monster *)0x0) goto LAB_00137a8f;
    wVar5 = monster_effect_level(pmVar4,L'\x02');
    lVar1 = 100;
    while( true ) {
      bVar6 = wVar5 == L'\0';
      wVar5 = wVar5 + L'\xffffffff';
      if (bVar6) break;
      lVar1 = (long)((int)lVar1 * 0x3c) / 100;
    }
    uVar3 = Rand_div(100);
    if ((int)uVar3 < (int)lVar1) {
      wVar5 = (pmVar4->target).midx;
      if (wVar5 < L'\x01') {
        _Var2 = monster_is_decoyed(pmVar4);
        if (!_Var2) goto LAB_001379ec;
        finish = cave_find_decoy(cave);
      }
      else {
        pmVar4 = cave_monster(cave,wVar5);
        finish.x = (pmVar4->grid).x;
        finish.y = (pmVar4->grid).y;
      }
    }
    else {
      uVar3 = Rand_div(9);
      finish = (loc)loc_sum(pmVar4->grid,(loc_conflict)ddgrid[(long)(int)uVar3 + 1]);
    }
  }
  else {
LAB_001379ec:
    finish.x = (player->grid).x;
    finish.y = (player->grid).y;
  }
  wVar5 = flg | 0x804;
  grid = finish;
LAB_00137a8f:
  origin_00._4_4_ = 0;
  _Var2 = project(origin_00,L'\0',finish,dam,typ,wVar5,L'\0','\0',obj);
  return _Var2;
}

Assistant:

static bool project_aimed(struct source origin,
						  int typ, int dir, int dam, int flg,
						  const struct object *obj)
{
	struct loc grid = loc(-1, -1);

	/* Pass through the target if needed */
	flg |= (PROJECT_THRU);

	get_target(origin, dir, &grid, &flg);

	/* Aim at the target, do NOT explode */
	return (project(origin, 0, grid, dam, typ, flg, 0, 0, obj));
}